

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O3

bool __thiscall msgpack11::MsgPackInt64::equals(MsgPackInt64 *this,MsgPackValue *other)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar4;
  
  iVar3 = (*other->_vptr_MsgPackValue[3])(other);
  if (iVar3 == 10) {
    iVar3 = (*other->_vptr_MsgPackValue[0xf])(other);
    uVar2 = (this->super_NumberValue<(msgpack11::MsgPack::Type)6,_long>).
            super_Value<(msgpack11::MsgPack::Type)6,_long>.m_value;
    bVar4 = CONCAT44(extraout_var_00,iVar3) == uVar2 &&
            -1 < (long)(uVar2 | CONCAT44(extraout_var_00,iVar3));
  }
  else {
    if (iVar3 != 6) {
      bVar4 = NumberValue<(msgpack11::MsgPack::Type)6,_long>::equals
                        (&this->super_NumberValue<(msgpack11::MsgPack::Type)6,_long>,other);
      return bVar4;
    }
    lVar1 = (this->super_NumberValue<(msgpack11::MsgPack::Type)6,_long>).
            super_Value<(msgpack11::MsgPack::Type)6,_long>.m_value;
    iVar3 = (*other->_vptr_MsgPackValue[0xb])(other);
    bVar4 = lVar1 == CONCAT44(extraout_var,iVar3);
  }
  return bVar4;
}

Assistant:

bool equals(const MsgPackValue * other) const override
    {
        switch( other->type() )
        {
            case MsgPack::INT64 :
            {
                return int64_value() == other->int64_value();
            } break;
            case MsgPack::UINT64 :
            {
                return equal_uint64_int64( other->uint64_value(), int64_value() );
            } break;
            default :
            {
                return NumberValue<MsgPack::INT64, int64_t>::equals( other );
            }
        }
    }